

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O3

void * direct_alloc(mstate m,size_t nb)

{
  void *pvVar1;
  ulong uVar2;
  ulong size;
  
  size = nb + 0x1036 & 0xfffffffffffff000;
  if ((nb < size) && (pvVar1 = mmap_probe(m->prng,size), pvVar1 != (void *)0xffffffffffffffff)) {
    uVar2 = (ulong)(-(int)pvVar1 - 0x10U & 7);
    *(ulong *)((long)pvVar1 + uVar2) = uVar2 | 1;
    *(ulong *)((long)pvVar1 + uVar2 + 8) = (size - uVar2) - 0x20 | 2;
    *(undefined8 *)((long)pvVar1 + (size - uVar2) + -0x18 + uVar2) = 0xb;
    *(undefined8 *)((long)pvVar1 + (size - 0x10)) = 0;
    return (void *)((long)pvVar1 + uVar2 + 0x10);
  }
  return (void *)0x0;
}

Assistant:

static void *direct_alloc(mstate m, size_t nb)
{
  size_t mmsize = mmap_align(nb + SIX_SIZE_T_SIZES + CHUNK_ALIGN_MASK);
  if (LJ_LIKELY(mmsize > nb)) {     /* Check for wrap around 0 */
    char *mm = (char *)(DIRECT_MMAP(m->prng, mmsize));
    if (mm != CMFAIL) {
      size_t offset = align_offset(chunk2mem(mm));
      size_t psize = mmsize - offset - DIRECT_FOOT_PAD;
      mchunkptr p = (mchunkptr)(mm + offset);
      p->prev_foot = offset | IS_DIRECT_BIT;
      p->head = psize|CINUSE_BIT;
      chunk_plus_offset(p, psize)->head = FENCEPOST_HEAD;
      chunk_plus_offset(p, psize+SIZE_T_SIZE)->head = 0;
      return chunk2mem(p);
    }
  }
  UNUSED(m);
  return NULL;
}